

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O0

void kill_eggs(obj *obj_list)

{
  boolean bVar1;
  obj *local_18;
  obj *otmp;
  obj *obj_list_local;
  
  for (local_18 = obj_list; local_18 != (obj *)0x0; local_18 = local_18->nobj) {
    if (local_18->otyp == 0x10f) {
      bVar1 = dead_species(local_18->corpsenm,'\x01');
      if (bVar1 != '\0') {
        kill_egg(local_18);
      }
    }
    else if (local_18->cobj != (obj *)0x0) {
      kill_eggs(local_18->cobj);
    }
  }
  return;
}

Assistant:

static void kill_eggs(struct obj *obj_list)
{
	struct obj *otmp;

	for (otmp = obj_list; otmp; otmp = otmp->nobj)
	    if (otmp->otyp == EGG) {
		if (dead_species(otmp->corpsenm, TRUE)) {
		    /*
		     * It seems we could also just catch this when
		     * it attempted to hatch, so we wouldn't have to
		     * search all of the objlists.. or stop all
		     * hatch timers based on a corpsenm.
		     */
		    kill_egg(otmp);
		}
	    } else if (Has_contents(otmp)) {
		kill_eggs(otmp->cobj);
	    }
}